

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

xml_node __thiscall pugi::xml_node::insert_move_after(xml_node *this,xml_node *moved,xml_node *node)

{
  xml_node_struct *pxVar1;
  xml_node_struct *pxVar2;
  bool bVar3;
  xml_node_struct **ppxVar4;
  xml_node_struct *pxVar5;
  xml_node_struct *pxVar6;
  xml_node_struct *pxVar7;
  xml_node local_20;
  
  bVar3 = impl::anon_unknown_0::allow_move(this,moved);
  if ((((!bVar3) || (pxVar1 = node->_root, pxVar1 == (xml_node_struct *)0x0)) ||
      (pxVar1->parent != this->_root)) || (pxVar5 = moved->_root, pxVar5 == pxVar1)) {
    xml_node(&local_20);
    return (xml_node)local_20._root;
  }
  pxVar1 = pxVar5->parent;
  pxVar2 = pxVar5->next_sibling;
  if (pxVar2 == (xml_node_struct *)0x0) {
    pxVar6 = pxVar1->first_child;
    pxVar5 = pxVar5->prev_sibling_c;
    if (pxVar6 == (xml_node_struct *)0x0) goto LAB_00189dce;
  }
  else {
    pxVar5 = pxVar5->prev_sibling_c;
    pxVar6 = pxVar2;
  }
  pxVar6->prev_sibling_c = pxVar5;
LAB_00189dce:
  ppxVar4 = &pxVar1->first_child;
  if (pxVar5->next_sibling != (xml_node_struct *)0x0) {
    ppxVar4 = &pxVar5->next_sibling;
  }
  *ppxVar4 = pxVar2;
  pxVar1 = moved->_root;
  pxVar5 = node->_root;
  pxVar2 = pxVar5->parent;
  pxVar1->parent = pxVar2;
  pxVar6 = pxVar5->next_sibling;
  pxVar7 = pxVar6;
  if (pxVar6 == (xml_node_struct *)0x0) {
    pxVar7 = pxVar2->first_child;
  }
  pxVar7->prev_sibling_c = pxVar1;
  pxVar1->next_sibling = pxVar6;
  pxVar1->prev_sibling_c = pxVar5;
  pxVar5->next_sibling = pxVar1;
  return (xml_node)moved->_root;
}

Assistant:

PUGI__FN xml_node xml_node::insert_move_after(const xml_node& moved, const xml_node& node)
	{
		if (!impl::allow_move(*this, moved)) return xml_node();
		if (!node._root || node._root->parent != _root) return xml_node();
		if (moved._root == node._root) return xml_node();

		impl::remove_node(moved._root);
		impl::insert_node_after(moved._root, node._root);

		return moved;
	}